

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_val_t * mpca_stmt_list_apply_to(mpc_val_t *x,void *s)

{
  undefined8 *__ptr;
  mpc_parser_t *p;
  mpc_parser_t *pmVar1;
  undefined8 *puVar2;
  
  for (puVar2 = (undefined8 *)x; __ptr = (undefined8 *)*puVar2, __ptr != (undefined8 *)0x0;
      puVar2 = puVar2 + 1) {
    p = mpca_grammar_find_parser((char *)*__ptr,(mpca_grammar_st_t *)s);
    if ((*(byte *)((long)s + 0x18) & 1) != 0) {
      pmVar1 = mpc_predictive((mpc_parser_t *)__ptr[2]);
      __ptr[2] = pmVar1;
    }
    pmVar1 = (mpc_parser_t *)__ptr[2];
    if ((char *)__ptr[1] != (char *)0x0) {
      pmVar1 = mpc_expect(pmVar1,(char *)__ptr[1]);
      __ptr[2] = pmVar1;
    }
    mpc_optimise(pmVar1);
    mpc_define(p,(mpc_parser_t *)__ptr[2]);
    free((void *)*__ptr);
    free((void *)__ptr[1]);
    free(__ptr);
  }
  free(x);
  return (mpc_val_t *)0x0;
}

Assistant:

static mpc_val_t *mpca_stmt_list_apply_to(mpc_val_t *x, void *s) {

  mpca_grammar_st_t *st = s;
  mpca_stmt_t *stmt;
  mpca_stmt_t **stmts = x;
  mpc_parser_t *left;

  while(*stmts) {
    stmt = *stmts;
    left = mpca_grammar_find_parser(stmt->ident, st);
    if (st->flags & MPCA_LANG_PREDICTIVE) { stmt->grammar = mpc_predictive(stmt->grammar); }
    if (stmt->name) { stmt->grammar = mpc_expect(stmt->grammar, stmt->name); }
    mpc_optimise(stmt->grammar);
    mpc_define(left, stmt->grammar);
    free(stmt->ident);
    free(stmt->name);
    free(stmt);
    stmts++;
  }

  free(x);

  return NULL;
}